

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.cpp
# Opt level: O3

void setnodevector(lua_State *L,Table *t,int size)

{
  int iVar1;
  Node *pNVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (size == 0) {
    pNVar2 = &dummynode_;
    t->node = &dummynode_;
    iVar1 = 0;
    uVar5 = 0;
  }
  else {
    iVar1 = luaO_ceillog2(size);
    if (0x1e < iVar1) {
      luaG_runerror(L,"table overflow");
    }
    uVar5 = (ulong)(uint)(1 << ((byte)iVar1 & 0x1f));
    pNVar2 = (Node *)luaM_realloc_(L,(void *)0x0,0,0x28L << ((byte)iVar1 & 0x3f));
    t->node = pNVar2;
    lVar3 = 0x20;
    uVar4 = uVar5;
    do {
      pNVar2 = t->node;
      *(undefined8 *)((long)&(pNVar2->i_val).value_ + lVar3) = 0;
      *(undefined4 *)((long)pNVar2 + lVar3 + -8) = 0;
      *(undefined4 *)((long)pNVar2 + lVar3 + -0x18) = 0;
      lVar3 = lVar3 + 0x28;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
    pNVar2 = t->node;
  }
  t->lsizenode = (lu_byte)iVar1;
  t->lastfree = pNVar2 + uVar5;
  return;
}

Assistant:

static void setnodevector (lua_State *L, Table *t, int size) {
  int lsize;
  if (size == 0) {  /* no elements to hash part? */
    t->node = cast(Node *, dummynode);  /* use common `dummynode' */
    lsize = 0;
  }
  else {
    int i;
    lsize = luaO_ceillog2(size);
    if (lsize > MAXBITS)
      luaG_runerror(L, "table overflow");
    size = twoto(lsize);
    t->node = luaM_newvector(L, size, Node);
    for (i=0; i<size; i++) {
      Node *n = gnode(t, i);
      gnext(n) = NULL;
      setnilvalue(gkey(n));
      setnilvalue(gval(n));
    }
  }
  t->lsizenode = cast_byte(lsize);
  t->lastfree = gnode(t, size);  /* all positions are free */
}